

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O3

axbStatus_t axbVecSet(axbVec_s *x,axbScalar_s *value)

{
  axbOpDescriptor_t *paVar1;
  axbStatus_t aVar2;
  
  if (x->init == 0x1d232) {
    paVar1 = x->opBackend->op_table;
    (*paVar1->func)(x,value,paVar1->func_data);
    aVar2 = 0;
  }
  else {
    axbVecSet_cold_1();
    aVar2 = 0x1d232;
  }
  return aVar2;
}

Assistant:

axbStatus_t axbVecSet(struct axbVec_s *x, const struct axbScalar_s *value)
{
  AXB_VECTOR_INIT_CHECK(x);

  axbOpDescriptor_t op_desc = x->opBackend->op_table[AXB_OP_VEC_SET];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, void*)) op_desc.func;
  op(x, value, op_desc.func_data);
  return 0;
}